

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O3

IssuanceParameter * __thiscall
cfd::ConfidentialTransactionContext::SetAssetIssuance
          (IssuanceParameter *__return_storage_ptr__,ConfidentialTransactionContext *this,
          OutPoint *outpoint,Amount *issue_amount,IssuanceOutputParameter *issue_output,
          Amount *token_amount,IssuanceOutputParameter *token_output,bool is_blind,
          ByteData256 *contract_hash)

{
  char cVar1;
  vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>
  token_output_list;
  vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>
  issue_output_list;
  
  issue_output_list.
  super__Vector_base<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  issue_output_list.
  super__Vector_base<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  issue_output_list.
  super__Vector_base<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  token_output_list.
  super__Vector_base<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  token_output_list.
  super__Vector_base<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  token_output_list.
  super__Vector_base<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>::
  push_back(&issue_output_list,issue_output);
  cVar1 = cfd::core::Amount::operator!=(token_amount,0);
  if (cVar1 != '\0') {
    std::vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>::
    push_back(&token_output_list,token_output);
  }
  SetAssetIssuance(__return_storage_ptr__,this,outpoint,issue_amount,&issue_output_list,token_amount
                   ,&token_output_list,is_blind,contract_hash);
  std::vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>::~vector
            (&token_output_list);
  std::vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>::~vector
            (&issue_output_list);
  return __return_storage_ptr__;
}

Assistant:

IssuanceParameter ConfidentialTransactionContext::SetAssetIssuance(
    const OutPoint& outpoint, const Amount& issue_amount,
    const IssuanceOutputParameter& issue_output, const Amount& token_amount,
    const IssuanceOutputParameter& token_output, bool is_blind,
    const ByteData256& contract_hash) {
  std::vector<IssuanceOutputParameter> issue_output_list;
  std::vector<IssuanceOutputParameter> token_output_list;
  issue_output_list.push_back(issue_output);
  if (token_amount != 0) token_output_list.push_back(token_output);
  return SetAssetIssuance(
      outpoint, issue_amount, issue_output_list, token_amount,
      token_output_list, is_blind, contract_hash);
}